

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O0

void saxpy(int n,float a,float *x,int incx,float *y,int incy)

{
  int iVar1;
  int local_38;
  int m;
  int iy;
  int ix;
  int i;
  int incy_local;
  float *y_local;
  int incx_local;
  float *x_local;
  float a_local;
  int n_local;
  
  if ((0 < n) && ((a != 0.0 || (NAN(a))))) {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iVar1 = n % 4, iy < n % 4; iy = iy + 1) {
        y[iy] = a * x[iy] + y[iy];
      }
      while (iy = iVar1, iy < n) {
        y[iy] = a * x[iy] + y[iy];
        y[iy + 1] = a * x[iy + 1] + y[iy + 1];
        y[iy + 2] = a * x[iy + 2] + y[iy + 2];
        y[iy + 3] = a * x[iy + 3] + y[iy + 3];
        iVar1 = iy + 4;
      }
    }
    else {
      if (incx < 0) {
        m = (1 - n) * incx;
      }
      else {
        m = 0;
      }
      if (incy < 0) {
        local_38 = (1 - n) * incy;
      }
      else {
        local_38 = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        y[local_38] = a * x[m] + y[local_38];
        m = m + incx;
        local_38 = local_38 + incy;
      }
    }
  }
  return;
}

Assistant:

void saxpy ( int n, float a, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SAXPY computes float constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in X and Y.
//
//    Input, float A, the multiplier of X.
//
//    Input, float X[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], the second vector.
//    On output, Y[*] has been replaced by Y[*] + A * X[*].
//
//    Input, int INCY, the increment between successive entries of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( a == 0.0 )
  {
    return;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      y[iy] = y[iy] + a * x[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 4;

    for ( i = 0; i < m; i++ )
    {
      y[i] = y[i] + a * x[i];
    }

    for ( i = m; i < n; i = i + 4 )
    {
      y[i  ] = y[i  ] + a * x[i  ];
      y[i+1] = y[i+1] + a * x[i+1];
      y[i+2] = y[i+2] + a * x[i+2];
      y[i+3] = y[i+3] + a * x[i+3];
    }
  }

  return;
}